

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O1

void __thiscall
FloatInterval_FloatDouble_Test::~FloatInterval_FloatDouble_Test
          (FloatInterval_FloatDouble_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FloatInterval, FloatDouble) {
    Interval<float> f = Interval<float>(2);
    Interval<double> d = Interval<double>(2);

    EXPECT_GT(Sqrt(d).LowerBound(), Sqrt(f).LowerBound());
    EXPECT_LT(Sqrt(d).UpperBound(), Sqrt(f).UpperBound());

    EXPECT_GT(Sqr(d).LowerBound(), Sqr(f).LowerBound());
    EXPECT_LT(Sqr(d).UpperBound(), Sqr(f).UpperBound());

    Interval<float> ff = Interval<float>(-.25, -.24);
    Interval<double> dd = Interval<double>(-.25, -.24);

    EXPECT_GT((d + dd).LowerBound(), (f + ff).LowerBound());
    EXPECT_LT((d + dd).UpperBound(), (f + ff).UpperBound());
    EXPECT_TRUE(InRange(1.75, f + ff));
    EXPECT_TRUE(InRange(1.75, d + dd));

    EXPECT_GT((d - dd).LowerBound(), (f - ff).LowerBound());
    EXPECT_LT((d - dd).UpperBound(), (f - ff).UpperBound());
    EXPECT_TRUE(InRange(2.25, f - ff));
    EXPECT_TRUE(InRange(2.25, d - dd));

    EXPECT_GT((d * dd).LowerBound(), (f * ff).LowerBound());
    EXPECT_LT((d * dd).UpperBound(), (f * ff).UpperBound());
    EXPECT_TRUE(InRange(-0.5, f * ff));
    EXPECT_TRUE(InRange(-0.5, d * dd));

    EXPECT_GT((d / dd).LowerBound(), (f / ff).LowerBound());
    EXPECT_LT((d / dd).UpperBound(), (f / ff).UpperBound());
    EXPECT_TRUE(InRange(-8, f / ff));
    EXPECT_TRUE(InRange(-8, d / dd));

    // Also, make sure all these variants of mixed types compile...
    EXPECT_TRUE(InRange(4, f + d));
    EXPECT_TRUE(InRange(0, f - d));
    EXPECT_TRUE(InRange(4, f * d));
    EXPECT_TRUE(InRange(1, f / d));

    f += d;
    EXPECT_TRUE(InRange(4, f));
    f *= d;
    EXPECT_TRUE(InRange(8, f));
    f /= d;
    EXPECT_TRUE(InRange(4, f));
    f -= d;
    EXPECT_TRUE(InRange(2, f));
}